

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

void __thiscall capnp::Schema::requireUsableAs(Schema *this,RawSchema *expected)

{
  RawSchema *pRVar1;
  bool _kjCondition;
  Fault f;
  
  pRVar1 = this->raw->generic;
  if (pRVar1 == expected) {
    return;
  }
  if (expected == (RawSchema *)0x0) {
    _kjCondition = false;
  }
  else {
    _kjCondition = pRVar1->canCastTo == expected;
    if (_kjCondition) {
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[62]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x146,FAILED,
             "raw->generic == expected || (expected != nullptr && raw->generic->canCastTo == expected)"
             ,"_kjCondition,\"This schema is not compatible with the requested native type.\"",
             &_kjCondition,
             (char (*) [62])"This schema is not compatible with the requested native type.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void Schema::requireUsableAs(const _::RawSchema* expected) const {
  KJ_REQUIRE(raw->generic == expected ||
             (expected != nullptr && raw->generic->canCastTo == expected),
             "This schema is not compatible with the requested native type.");
}